

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  long lVar1;
  char *pcVar2;
  XMLAttribute *pXVar3;
  XMLAttribute **ppXVar4;
  long lVar5;
  XMLAttribute *pXVar6;
  bool bVar7;
  bool bVar8;
  
  pXVar3 = this->_rootAttribute;
  if (this->_rootAttribute == (XMLAttribute *)0x0) {
    pXVar6 = (XMLAttribute *)0x0;
  }
  else {
    do {
      pXVar6 = pXVar3;
      pcVar2 = StrPair::GetStr(&pXVar6->_name);
      if (pcVar2 == name) {
        return pXVar6;
      }
      bVar7 = *pcVar2 == '\0';
      if ((bVar7) || (*pcVar2 != *name)) {
        bVar8 = false;
        pcVar2 = name;
      }
      else {
        lVar1 = 1;
        do {
          lVar5 = lVar1;
          bVar7 = pcVar2[lVar5] == '\0';
          if ((bVar7) || (pcVar2[lVar5] != name[lVar5])) break;
          lVar1 = lVar5 + 1;
        } while ((int)lVar5 != 0x7fffffff);
        bVar8 = (int)lVar5 == 0x7fffffff;
        pcVar2 = name + lVar5;
      }
      if (bVar8) {
        return pXVar6;
      }
      if ((bVar7) && (*pcVar2 == '\0')) {
        return pXVar6;
      }
      pXVar3 = pXVar6->_next;
    } while (pXVar6->_next != (XMLAttribute *)0x0);
  }
  pXVar3 = (XMLAttribute *)MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
  pXVar3->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00272ae0;
  (pXVar3->_name)._flags = 0;
  (pXVar3->_name)._start = (char *)0x0;
  (pXVar3->_name)._end = (char *)0x0;
  (pXVar3->_value)._flags = 0;
  (pXVar3->_value)._start = (char *)0x0;
  (pXVar3->_value)._end = (char *)0x0;
  pXVar3->_next = (XMLAttribute *)0x0;
  pXVar3->_memPool = (MemPool *)0x0;
  pXVar3->_memPool = &(((this->super_XMLNode)._document)->_attributePool).super_MemPool;
  ppXVar4 = &pXVar6->_next;
  if (pXVar6 == (XMLAttribute *)0x0) {
    ppXVar4 = &this->_rootAttribute;
  }
  *ppXVar4 = pXVar3;
  StrPair::SetStr(&pXVar3->_name,name,0);
  (*pXVar3->_memPool->_vptr_MemPool[5])();
  return pXVar3;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
        attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
        attrib->_memPool = &_document->_attributePool;
        if ( last ) {
            last->_next = attrib;
        }
        else {
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
        attrib->_memPool->SetTracked(); // always created and linked.
    }
    return attrib;
}